

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.h
# Opt level: O1

Group * __thiscall Group::operator=(Group *this,Group *other)

{
  if (this != other) {
    this->id = other->id;
    std::__cxx11::string::_M_assign((string *)&this->name);
    std::vector<Subject,_std::allocator<Subject>_>::operator=(&this->subjects,&other->subjects);
    this->size = other->size;
  }
  return this;
}

Assistant:

Group& operator=(const Group& other) {
        if (this != &other) {
            this->id = other.id;
            this->name = other.name;
            this->subjects = other.subjects;
            this->size = other.size;
        }
        return *this;
    }